

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<char[19],int,int,int>
          (Capturer *this,size_t index,char (*value) [19],int *values,int *values_1,int *values_2)

{
  string local_50;
  
  StringMaker<char[19],void>::convert_abi_cxx11_
            (&local_50,(StringMaker<char[19],void> *)value,*value);
  captureValue(this,index,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  captureValues<int,int,int>(this,index + 1,values,values_1,values_2);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }